

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_slice.c
# Opt level: O0

size_t slice_fread(ALLEGRO_FILE *f,void *ptr,size_t size)

{
  void *pvVar1;
  long in_RDX;
  size_t in_RSI;
  ALLEGRO_FILE *in_RDI;
  size_t b;
  SLICE_DATA *slice;
  long local_20;
  ALLEGRO_FILE *in_stack_fffffffffffffff8;
  size_t sVar2;
  
  pvVar1 = al_get_file_userdata(in_RDI);
  if ((*(uint *)((long)pvVar1 + 0x20) & 1) == 0) {
    sVar2 = 0;
  }
  else {
    local_20 = in_RDX;
    if (((*(uint *)((long)pvVar1 + 0x20) & 4) == 0) &&
       (*(ulong *)((long)pvVar1 + 0x18) < (ulong)(*(long *)((long)pvVar1 + 0x10) + in_RDX))) {
      local_20 = *(long *)((long)pvVar1 + 0x18) - *(long *)((long)pvVar1 + 0x10);
    }
    if (local_20 == 0) {
      sVar2 = 0;
    }
    else {
      sVar2 = al_fread(in_stack_fffffffffffffff8,in_RDI,in_RSI);
      *(size_t *)((long)pvVar1 + 0x10) = sVar2 + *(long *)((long)pvVar1 + 0x10);
      if (*(ulong *)((long)pvVar1 + 0x18) < *(ulong *)((long)pvVar1 + 0x10)) {
        *(undefined8 *)((long)pvVar1 + 0x18) = *(undefined8 *)((long)pvVar1 + 0x10);
      }
    }
  }
  return sVar2;
}

Assistant:

static size_t slice_fread(ALLEGRO_FILE *f, void *ptr, size_t size)
{
   SLICE_DATA *slice = al_get_file_userdata(f);
   
   if (!(slice->mode & SLICE_READ)) {
      /* no read permissions */
      return 0;
   }
   
   if (!(slice->mode & SLICE_EXPANDABLE) && slice->pos + size > slice->size) {
      /* don't read past the buffer size if not expandable */
      size = slice->size - slice->pos;
   }
   
   if (!size) {
      return 0;
   }
   else {
      /* unbuffered, read directly from parent file */
      size_t b = al_fread(slice->fp, ptr, size);
      slice->pos += b;
   
      if (slice->pos > slice->size)
         slice->size = slice->pos;
      
      return b;
   }
}